

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O3

int xmlThrDefDefaultBufferSize(int v)

{
  int iVar1;
  
  xmlMutexLock(xmlThrDefMutex);
  iVar1 = xmlDefaultBufferSizeThrDef;
  xmlDefaultBufferSizeThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefDefaultBufferSize(int v) {
    int ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlDefaultBufferSizeThrDef;
    xmlDefaultBufferSizeThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}